

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ManagedType MVar3;
  
  if (this->DLLPlatform != true) {
    return false;
  }
  TVar2 = cmTarget::GetType(this->Target);
  if ((TVar2 != SHARED_LIBRARY) && (bVar1 = IsExecutableWithExports(this), !bVar1)) {
    return false;
  }
  MVar3 = GetManagedType(this,config);
  return MVar3 != Managed;
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed);
}